

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_array_add_elem(jx9_value *pArray,jx9_value *pKey,jx9_value *pValue)

{
  sxi32 sVar1;
  
  if ((pArray->iFlags & 0x40) == 0) {
    return -0x18;
  }
  sVar1 = HashmapInsert((jx9_hashmap *)(pArray->x).pOther,pKey,pValue);
  return sVar1;
}

Assistant:

JX9_PRIVATE int jx9_array_add_elem(jx9_value *pArray, jx9_value *pKey, jx9_value *pValue)
{
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, &(*pKey), &(*pValue));
	return rc;
}